

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O2

void __thiscall XInputSimulatorImplLinux::mouseScrollY(XInputSimulatorImplLinux *this,int length)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  uVar1 = (uint)length >> 0x1f ^ 5;
  iVar2 = -length;
  if (0 < length) {
    iVar2 = length;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[4])(this,(ulong)uVar1);
    (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[5])(this,(ulong)uVar1);
  }
  return;
}

Assistant:

void XInputSimulatorImplLinux::mouseScrollY(int length)
{
    int button;
    if(length < 0){
        button = 4;  //scroll up button
    }else{
        button = 5;  //scroll down button
    }

    if(length < 0){
        length *= -1;
    }

    for(int cnt = 0; cnt < length; cnt++){
        this->mouseDown(button);
        this->mouseUp(button);
    }
}